

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

lyxp_expr * lyxp_parse_expr(char *expr)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  lyxp_expr *expr_00;
  char *pcVar8;
  lyxp_token *ptr;
  uint8_t *ptr_00;
  ulong uVar9;
  ushort **ppuVar10;
  uint8_t **ppuVar11;
  LY_ERR *pLVar12;
  char cVar13;
  lyxp_token lVar14;
  long lVar15;
  ulong uVar16;
  short sVar17;
  ulong uVar18;
  ulong uVar19;
  ushort uVar20;
  bool bVar21;
  uint16_t *local_70;
  
  expr_00 = (lyxp_expr *)calloc(1,0x30);
  if (expr_00 != (lyxp_expr *)0x0) {
    pcVar8 = strdup(expr);
    expr_00->expr = pcVar8;
    if (pcVar8 != (char *)0x0) {
      expr_00->size = 10;
      ptr = (lyxp_token *)malloc(0x28);
      expr_00->tokens = ptr;
      if (ptr != (lyxp_token *)0x0) {
        local_70 = (uint16_t *)malloc(0x14);
        expr_00->expr_pos = local_70;
        if (local_70 != (uint16_t *)0x0) {
          ptr_00 = (uint8_t *)malloc(10);
          expr_00->tok_len = ptr_00;
          if (ptr_00 != (uint8_t *)0x0) {
            uVar20 = 0;
            while ((uVar9 = (ulong)(byte)expr[uVar20], uVar9 < 0x21 &&
                   ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
              uVar20 = uVar20 + 1;
            }
            uVar16 = 10;
            uVar18 = 0;
            bVar21 = false;
            do {
              uVar6 = (uint)uVar16;
              uVar19 = (ulong)uVar20;
              pcVar8 = expr + uVar19;
              cVar13 = (char)uVar9;
              uVar3 = 1;
              uVar4 = 1;
              uVar7 = (uint)uVar9;
              sVar17 = (short)uVar18;
              bVar2 = bVar21;
              if (0x3f < uVar7) {
                if (uVar7 == 0x40) {
                  lVar14 = LYXP_TOKEN_AT;
                }
                else if (uVar7 == 0x5b) {
                  lVar14 = LYXP_TOKEN_BRACK1;
                }
                else {
                  if (uVar7 != 0x5d) goto switchD_00164ea7_caseD_23;
                  lVar14 = LYXP_TOKEN_BRACK2;
                }
                goto LAB_0016503c;
              }
              switch(uVar7) {
              case 0x22:
                uVar3 = 1;
                do {
                  uVar9 = (ulong)uVar3;
                  uVar3 = uVar3 + 1;
                } while (pcVar8[uVar9] != '\"');
                goto LAB_00165010;
              default:
switchD_00164ea7_caseD_23:
                ppuVar10 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar10 + (long)cVar13 * 2 + 1) & 8) == 0) {
                  if (uVar7 < 0x3c) {
                    if (uVar7 < 0x2d) {
                      if (uVar7 == 0x21) {
                        if (pcVar8[1] != '=') goto LAB_0016539f;
LAB_00165395:
                        lVar14 = LYXP_TOKEN_OPERATOR_COMP;
                        goto LAB_00165026;
                      }
                      if (uVar7 == 0x2b) goto LAB_00165384;
                    }
                    else {
                      if (uVar7 == 0x2d) {
LAB_00165384:
                        lVar14 = LYXP_TOKEN_OPERATOR_MATH;
                        break;
                      }
                      if (uVar7 == 0x2f) {
                        uVar3 = (pcVar8[1] == '/') + 1;
                        lVar14 = LYXP_TOKEN_OPERATOR_PATH;
                        break;
                      }
                    }
LAB_0016539f:
                    if ((sVar17 == 0) ||
                       ((ptr[((uint)uVar18 & 0xffff) - 1] < LYXP_TOKEN_LITERAL &&
                        ((0x1f18aU >>
                          (ptr[((uint)uVar18 & 0xffff) - 1] &
                          (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1) != 0)))) {
                      lVar14 = LYXP_TOKEN_NAMETEST;
                      if (cVar13 != '*') {
                        uVar3 = parse_ncname(pcVar8);
                        if (uVar3 == 0) {
LAB_0016560a:
                          cVar13 = *pcVar8;
                          goto LAB_0016561b;
                        }
                        lVar14 = LYXP_TOKEN_NAMETEST;
                        if (expr[uVar3 + uVar19] == ':') {
                          lVar15 = uVar19 + (ushort)(uVar3 + 1);
                          if (expr[lVar15] == '*') {
                            uVar3 = uVar3 + 2;
                            bVar2 = false;
                          }
                          else {
                            uVar4 = parse_ncname(expr + lVar15);
                            if (uVar4 == 0) goto LAB_0016560a;
                            lVar14 = LYXP_TOKEN_NAMETEST;
                            uVar3 = uVar4 + uVar3 + 1;
                            bVar2 = false;
                          }
                        }
                        else {
                          bVar2 = true;
                        }
                      }
                    }
                    else {
                      if (99 < uVar7) {
                        if (uVar7 == 100) {
                          if (pcVar8[1] == 'i') {
                            bVar21 = pcVar8[2] == 'v';
LAB_00165597:
                            lVar14 = LYXP_TOKEN_OPERATOR_MATH;
                            uVar3 = 3;
                            if (bVar21) break;
                          }
                        }
                        else if (uVar7 == 0x6d) {
                          if (pcVar8[1] == 'o') {
                            bVar21 = pcVar8[2] == 'd';
                            goto LAB_00165597;
                          }
                        }
                        else if ((uVar7 == 0x6f) && (pcVar8[1] == 'r')) {
                          uVar3 = 2;
                          goto LAB_0016551e;
                        }
LAB_0016561b:
                        ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)cVar13,pcVar8)
                        ;
                        goto LAB_001655ee;
                      }
                      if (uVar7 == 0x2a) {
                        lVar14 = LYXP_TOKEN_OPERATOR_MATH;
                        uVar3 = uVar4;
                      }
                      else {
                        if (((uVar7 != 0x61) || (pcVar8[1] != 'n')) || (pcVar8[2] != 'd'))
                        goto LAB_0016561b;
                        uVar3 = 3;
LAB_0016551e:
                        lVar14 = LYXP_TOKEN_OPERATOR_LOG;
                      }
                    }
                  }
                  else {
                    if (uVar7 < 0x3e) {
                      if (uVar7 == 0x3c) goto LAB_00165373;
                      if (uVar7 != 0x3d) goto LAB_0016539f;
                    }
                    else {
                      if (uVar7 != 0x3e) {
                        lVar14 = LYXP_TOKEN_OPERATOR_UNI;
                        if (uVar7 == 0x7c) break;
                        goto LAB_0016539f;
                      }
LAB_00165373:
                      if (pcVar8[1] == '=') goto LAB_00165395;
                    }
                    lVar14 = LYXP_TOKEN_OPERATOR_COMP;
                  }
                }
                else {
LAB_001652a7:
                  uVar3 = 0xffff;
                  do {
                    uVar3 = uVar3 + 1;
                  } while ((*(byte *)((long)*ppuVar10 + (long)expr[uVar3 + uVar19] * 2 + 1) & 8) !=
                           0);
                  lVar14 = LYXP_TOKEN_NUMBER;
                  if (expr[uVar3 + uVar19] == '.') {
                    do {
                      uVar3 = uVar3 + 1;
                    } while ((*(byte *)((long)*ppuVar10 + (long)expr[uVar3 + uVar19] * 2 + 1) & 8)
                             != 0);
                  }
                }
                break;
              case 0x27:
                uVar3 = 1;
                do {
                  uVar9 = (ulong)uVar3;
                  uVar3 = uVar3 + 1;
                } while (pcVar8[uVar9] != '\'');
LAB_00165010:
                lVar14 = LYXP_TOKEN_LITERAL;
                break;
              case 0x28:
                lVar14 = LYXP_TOKEN_PAR1;
                uVar3 = uVar4;
                bVar2 = false;
                if (bVar21) {
                  if (sVar17 != 0) {
                    uVar9 = uVar18 & 0xffff;
                    uVar7 = (int)uVar9 - 1;
                    if (ptr[uVar7] == LYXP_TOKEN_NAMETEST) {
                      if (ptr_00[uVar7] == '\x04') {
                        uVar1 = local_70[uVar7];
                        iVar5 = strncmp(expr + uVar1,"node",4);
                        if ((iVar5 != 0) && (iVar5 = strncmp(expr + uVar1,"text",4), iVar5 != 0))
                        goto LAB_00164f99;
                      }
                      else {
LAB_00164f99:
                        if ((ptr_00[uVar9 - 1] != '\a') ||
                           (iVar5 = strncmp(expr + local_70[uVar9 - 1],"comment",7), iVar5 != 0)) {
                          lVar14 = LYXP_TOKEN_PAR1;
                          ptr[uVar9 - 1] = LYXP_TOKEN_FUNCNAME;
                          bVar2 = false;
                          break;
                        }
                      }
                      lVar14 = LYXP_TOKEN_PAR1;
                      ptr[uVar9 - 1] = LYXP_TOKEN_NODETYPE;
                      bVar2 = false;
                      break;
                    }
                  }
                  bVar2 = true;
                }
                break;
              case 0x29:
                lVar14 = LYXP_TOKEN_PAR2;
                break;
              case 0x2c:
                lVar14 = LYXP_TOKEN_COMMA;
                break;
              case 0x2e:
                if (pcVar8[1] == '.') {
                  lVar14 = LYXP_TOKEN_DDOT;
LAB_00165026:
                  uVar3 = 2;
                }
                else {
                  ppuVar10 = __ctype_b_loc();
                  lVar14 = LYXP_TOKEN_DOT;
                  uVar3 = uVar4;
                  if ((*(byte *)((long)*ppuVar10 + (long)pcVar8[1] * 2 + 1) & 8) != 0)
                  goto LAB_001652a7;
                }
              }
LAB_0016503c:
              bVar21 = bVar2;
              if (sVar17 == (short)uVar16) {
                uVar6 = uVar6 + 5;
                expr_00->size = (uint16_t)uVar6;
                uVar7 = uVar6 & 0xffff;
                ptr = (lyxp_token *)ly_realloc(ptr,(ulong)(uVar7 * 4));
                expr_00->tokens = ptr;
                if (ptr == (lyxp_token *)0x0) {
                  pLVar12 = ly_errno_location();
                  *pLVar12 = LY_EMEM;
                  ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
                  ptr = (lyxp_token *)0x0;
                  uVar18 = uVar16;
                }
                else {
                  local_70 = (uint16_t *)ly_realloc(local_70,(ulong)(uVar7 * 2));
                  expr_00->expr_pos = local_70;
                  if (local_70 == (uint16_t *)0x0) {
                    pLVar12 = ly_errno_location();
                    *pLVar12 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
                    local_70 = (uint16_t *)0x0;
                    uVar18 = uVar16;
                  }
                  else {
                    ptr_00 = (uint8_t *)ly_realloc(ptr_00,(ulong)uVar7);
                    expr_00->tok_len = ptr_00;
                    if (ptr_00 != (uint8_t *)0x0) goto LAB_001650e4;
                    pLVar12 = ly_errno_location();
                    *pLVar12 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
                    ptr_00 = (uint8_t *)0x0;
                    uVar18 = uVar16;
                  }
                }
              }
              else {
LAB_001650e4:
                ptr[uVar18 & 0xffff] = lVar14;
                local_70[uVar18 & 0xffff] = uVar20;
                ptr_00[expr_00->used] = (uint8_t)uVar3;
                uVar7 = *(int *)&expr_00->used + 1;
                expr_00->used = (uint16_t)uVar7;
                uVar18 = (ulong)uVar7;
              }
              uVar20 = uVar3 + uVar20;
              while (uVar9 = (ulong)(byte)expr[uVar20], uVar9 < 0x21) {
                if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
                  if (uVar9 == 0) {
                    ppuVar11 = (uint8_t **)calloc((ulong)(uVar6 & 0xffff),8);
                    expr_00->repeat = ppuVar11;
                    if (ppuVar11 != (uint8_t **)0x0) {
                      return expr_00;
                    }
                    goto LAB_001655cc;
                  }
                  break;
                }
                uVar20 = uVar20 + 1;
              }
              uVar16 = (ulong)uVar6;
            } while( true );
          }
        }
      }
    }
  }
LAB_001655cc:
  pLVar12 = ly_errno_location();
  *pLVar12 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
LAB_001655ee:
  lyxp_expr_free(expr_00);
  return (lyxp_expr *)0x0;
}

Assistant:

struct lyxp_expr *
lyxp_parse_expr(const char *expr)
{
    struct lyxp_expr *ret;
    uint16_t parsed = 0, tok_len, ncname_len;
    enum lyxp_token tok_type;
    int prev_function_check = 0;

    /* init lyxp_expr structure */
    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        goto error;
    }
    ret->expr = strdup(expr);
    if (!ret->expr) {
        LOGMEM;
        goto error;
    }
    ret->used = 0;
    ret->size = LYXP_EXPR_SIZE_START;
    ret->tokens = malloc(ret->size * sizeof *ret->tokens);
    if (!ret->tokens) {
        LOGMEM;
        goto error;
    }
    ret->expr_pos = malloc(ret->size * sizeof *ret->expr_pos);
    if (!ret->expr_pos) {
        LOGMEM;
        goto error;
    }
    ret->tok_len = malloc(ret->size * sizeof *ret->tok_len);
    if (!ret->tok_len) {
        LOGMEM;
        goto error;
    }

    while (is_xmlws(expr[parsed])) {
        ++parsed;
    }

    do {
        if (expr[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_function_check && ret->used && (ret->tokens[ret->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is a NodeType/FunctionName after all */
                if (((ret->tok_len[ret->used - 1] == 4)
                        && (!strncmp(&expr[ret->expr_pos[ret->used - 1]], "node", 4)
                        || !strncmp(&expr[ret->expr_pos[ret->used - 1]], "text", 4))) ||
                        ((ret->tok_len[ret->used - 1] == 7)
                        && !strncmp(&expr[ret->expr_pos[ret->used - 1]], "comment", 7))) {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_NODETYPE;
                } else {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_FUNCNAME;
                }
                prev_function_check = 0;
            }

        } else if (expr[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr[parsed] == '.') && (!isdigit(expr[parsed+1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; expr[parsed + tok_len] != '\''; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; expr[parsed + tok_len] != '\"'; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr[parsed] == '.') || (isdigit(expr[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr[parsed + tok_len]); ++tok_len);
            if (expr[parsed + tok_len] == '.') {
                ++tok_len;
                for (; isdigit(expr[parsed + tok_len]); ++tok_len);
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr[parsed], "//", 2)) {
                tok_len = 2;
            } else {
                tok_len = 1;
            }
            tok_type = LYXP_TOKEN_OPERATOR_PATH;

        } else if  (!strncmp(&expr[parsed], "!=", 2) || !strncmp(&expr[parsed], "<=", 2)
                || !strncmp(&expr[parsed], ">=", 2)) {

            /* Operator '!=', '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (expr[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_UNI;

        } else if ((expr[parsed] == '+') || (expr[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_MATH;

        } else if ((expr[parsed] == '=') || (expr[parsed] == '<') || (expr[parsed] == '>')) {

            /* Operator '=', '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (ret->used && (ret->tokens[ret->used - 1] != LYXP_TOKEN_AT)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_PAR1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_BRACK1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_COMMA)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_LOG)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_COMP)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_MATH)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_UNI)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_PATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else if (!strncmp(&expr[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "mod", 3) || !strncmp(&expr[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
        } else if (expr[parsed] == '*') {

            /* NameTest '*' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_NAMETEST;

        } else {

            /* NameTest (NCName ':' '*' | QName) or NodeType/FunctionName */
            ncname_len = parse_ncname(&expr[parsed]);
            if (!ncname_len) {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
            tok_len = ncname_len;

            if (expr[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr[parsed + tok_len]);
                    if (!ncname_len) {
                        LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                        goto error;
                    }
                    tok_len += ncname_len;
                }
                /* remove old flag to prevent ambiguities */
                prev_function_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* there is no prefix so it can still be NodeType/FunctioName, we can't finally decide now */
                prev_function_check = 1;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        exp_add_token(ret, tok_type, parsed, tok_len);
        parsed += tok_len;
        while (is_xmlws(expr[parsed])) {
            ++parsed;
        }

    } while (expr[parsed]);

    /* prealloc repeat */
    ret->repeat = calloc(ret->size, sizeof *ret->repeat);
    if (!ret->repeat) {
        LOGMEM;
        goto error;
    }

    return ret;

error:
    lyxp_expr_free(ret);
    return NULL;
}